

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_QueueSetFilterParameters
               (FAudioVoice *voice,FAudioFilterParameters *pParameters,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar1 = QueueOperation(voice,FAUDIOOP_SETFILTERPARAMETERS,OperationSet);
  SDL_memcpy(&pFVar1->Data,pParameters,0xc);
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetFilterParameters(
	FAudioVoice *voice,
	const FAudioFilterParameters *pParameters,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETFILTERPARAMETERS,
		OperationSet
	);

	FAudio_memcpy(
		&op->Data.SetFilterParameters.Parameters,
		pParameters,
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}